

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

int SSL_CREDENTIAL_set1_delegated_credential(SSL_CREDENTIAL *cred,CRYPTO_BUFFER *dc)

{
  EVP_PKEY *privkey;
  _Head_base<0UL,_evp_pkey_st_*,_false> __p_00;
  bool bVar1;
  int iVar2;
  int line;
  pointer __p;
  uint16_t dc_cert_verify_algorithm;
  uint16_t algorithm;
  UniquePtr<EVP_PKEY> pubkey;
  CBS cbs;
  uint32_t valid_time;
  CBS spki;
  CBS sig;
  uint16_t local_74;
  uint16_t local_72;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_70;
  CBS local_68;
  uint32_t local_54;
  CBS local_50;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_40;
  CBS local_38;
  
  if (cred->type == kDelegated) {
    CRYPTO_BUFFER_init_CBS(dc,&local_68);
    iVar2 = CBS_get_u32(&local_68,&local_54);
    if (((((iVar2 == 0) || (iVar2 = CBS_get_u16(&local_68,&local_74), iVar2 == 0)) ||
         (iVar2 = CBS_get_u24_length_prefixed(&local_68,&local_50), iVar2 == 0)) ||
        ((iVar2 = CBS_get_u16(&local_68,&local_72), iVar2 == 0 ||
         (iVar2 = CBS_get_u16_length_prefixed(&local_68,&local_38), iVar2 == 0)))) ||
       ((local_38.len == 0 || (local_68.len != 0)))) {
      iVar2 = 0x89;
      line = 0x1a2;
    }
    else {
      iVar2 = SSL_get_signature_algorithm_key_type(local_74);
      if (iVar2 != 6) {
        local_70._M_head_impl = EVP_parse_public_key(&local_50);
        if ((local_70._M_head_impl == (EVP_PKEY *)0x0) || (local_50.len != 0)) {
          iVar2 = 0;
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                        ,0x1b1);
        }
        else {
          bVar1 = bssl::Array<unsigned_short>::InitUninitialized(&cred->sigalgs,1);
          iVar2 = 0;
          if (bVar1) {
            *(cred->sigalgs).data_ = local_74;
            privkey = (cred->privkey)._M_t.
                      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
            if ((privkey == (EVP_PKEY *)0x0) ||
               (bVar1 = bssl::ssl_compare_public_and_private_key(local_70._M_head_impl,privkey),
               bVar1)) {
              if (dc != (CRYPTO_BUFFER *)0x0) {
                CRYPTO_BUFFER_up_ref(dc);
              }
              local_40._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                   (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
              std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)&cred->dc,dc)
              ;
              std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_40);
              __p_00._M_head_impl = local_70._M_head_impl;
              local_70._M_head_impl = (EVP_PKEY *)0x0;
              std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&cred->pubkey,
                         __p_00._M_head_impl);
              cred->dc_algorithm = local_72;
              iVar2 = 1;
            }
          }
        }
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_70);
        return iVar2;
      }
      iVar2 = 0x127;
      line = 0x1ab;
    }
  }
  else {
    iVar2 = 0x42;
    line = 0x191;
  }
  ERR_put_error(0x10,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                ,line);
  return 0;
}

Assistant:

int SSL_CREDENTIAL_set1_delegated_credential(SSL_CREDENTIAL *cred,
                                             CRYPTO_BUFFER *dc) {
  if (cred->type != SSLCredentialType::kDelegated) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Parse the delegated credential to check for validity, and extract a few
  // fields from it. See RFC 9345, section 4.
  CBS cbs, spki, sig;
  uint32_t valid_time;
  uint16_t dc_cert_verify_algorithm, algorithm;
  CRYPTO_BUFFER_init_CBS(dc, &cbs);
  if (!CBS_get_u32(&cbs, &valid_time) ||
      !CBS_get_u16(&cbs, &dc_cert_verify_algorithm) ||
      !CBS_get_u24_length_prefixed(&cbs, &spki) ||
      !CBS_get_u16(&cbs, &algorithm) ||
      !CBS_get_u16_length_prefixed(&cbs, &sig) ||  //
      CBS_len(&sig) == 0 ||                        //
      CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }

  // RFC 9345 forbids algorithms that use the rsaEncryption OID. As the
  // RSASSA-PSS OID is unusably complicated, this effectively means we will not
  // support RSA delegated credentials.
  if (SSL_get_signature_algorithm_key_type(dc_cert_verify_algorithm) ==
      EVP_PKEY_RSA) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return 0;
  }

  UniquePtr<EVP_PKEY> pubkey(EVP_parse_public_key(&spki));
  if (pubkey == nullptr || CBS_len(&spki) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }

  if (!cred->sigalgs.CopyFrom(Span(&dc_cert_verify_algorithm, 1))) {
    return 0;
  }

  if (cred->privkey != nullptr &&
      !ssl_compare_public_and_private_key(pubkey.get(), cred->privkey.get())) {
    return 0;
  }

  cred->dc = UpRef(dc);
  cred->pubkey = std::move(pubkey);
  cred->dc_algorithm = algorithm;
  return 1;
}